

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O0

void __thiscall argo::pointer::build_from_uri_fragment(pointer *this,string *pointer)

{
  bool bVar1;
  long lVar2;
  token local_98;
  token local_58;
  size_t local_28;
  size_t end;
  size_t start;
  string *pointer_local;
  pointer *this_local;
  
  end = 1;
  local_28 = 0;
  start = (size_t)pointer;
  pointer_local = (string *)this;
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 1) {
    token::token(&local_58);
    std::__cxx11::list<argo::pointer::token,_std::allocator<argo::pointer::token>_>::push_back
              (&this->m_path,&local_58);
    token::~token(&local_58);
  }
  else {
    while (bVar1 = next_token(this,(string *)start,&end,&local_28), bVar1) {
      translate_uri_token(&local_98,this,(string *)start,&end,&local_28);
      std::__cxx11::list<argo::pointer::token,_std::allocator<argo::pointer::token>_>::push_back
                (&this->m_path,&local_98);
      token::~token(&local_98);
    }
  }
  return;
}

Assistant:

void pointer::build_from_uri_fragment(const std::string &pointer)
{
    size_t start = 1;
    size_t end = 0;

    if (pointer.size() == 1)
    {
        m_path.push_back(token());
    }
    else
    {
        while (next_token(pointer, start, end))
        {
            m_path.push_back(translate_uri_token(pointer, start, end));
        }
    }
}